

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O3

bool __thiscall
NativeCodeGenerator::Process(NativeCodeGenerator *this,Job *job,ParallelThreadData *threadData)

{
  byte bVar1;
  FunctionBody *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LoopEntryPointInfo *this_01;
  CodeGenWorkItem *codeGenWork;
  PageAllocator *pageAllocator;
  
  if (threadData == (ParallelThreadData *)0x0) {
    pageAllocator = &(this->scriptContext->threadContext->pageAllocator).super_PageAllocator;
  }
  else {
    pageAllocator = &threadData->backgroundPageAllocator;
  }
  codeGenWork = (CodeGenWorkItem *)&job[-1].isCritical;
  if (job == (Job *)0x0) {
    codeGenWork = (CodeGenWorkItem *)0x0;
  }
  bVar1 = (codeGenWork->jitData).type;
  if (bVar1 == '\0') {
    if (((DAT_015ada8a == '\0') && (DAT_0159efaa == '\0')) &&
       (bVar3 = WorkItemExceedsJITLimits(codeGenWork), bVar3)) {
      job->failureReason = ExceedJITLimit;
      return false;
    }
    goto LAB_005f97cc;
  }
  if (bVar1 != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x782,"((0))","(0)");
    if (bVar3) {
      *puVar4 = 0;
      job->failureReason = Unknown;
      return false;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  this_00 = codeGenWork->functionBody;
  if (((this_00->field_0x178 & 2) == 0) || (this_00->m_depth != 0)) {
LAB_005f976b:
    bVar3 = Js::FunctionProxy::IsJitLoopBodyPhaseForced((FunctionProxy *)this_00);
    if (((bVar3) && (((this_00->super_ParseableFunctionInfo).flags & Flags_HasTry) == Flags_None))
       || (bVar3 = WorkItemExceedsJITLimits(codeGenWork), !bVar3)) {
LAB_005f97cc:
      CodeGen(this,pageAllocator,codeGenWork,threadData == (ParallelThreadData *)0x0);
      return true;
    }
    Js::EntryPointInfo::SetJITCapReached(codeGenWork->entryPointInfo);
  }
  else {
    if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) != 0) {
      this_01 = Js::LoopHeader::GetCurrentEntryPointInfo
                          ((LoopHeader *)
                           codeGenWork[1].super_Job.
                           super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                           previous);
      bVar3 = Js::EntryPointInfo::GetIsTJMode(&this_01->super_EntryPointInfo);
      if (bVar3) goto LAB_005f976b;
    }
    *(undefined4 *)
     &(codeGenWork[1].super_Job.super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
      previous)->manager = 0;
  }
  return false;
}

Assistant:

bool
NativeCodeGenerator::Process(JsUtil::Job *const job, JsUtil::ParallelThreadData *threadData)
{
    const bool foreground = !threadData;
    PageAllocator *pageAllocator;
    if (foreground)
    {
        pageAllocator = scriptContext->GetThreadContext()->GetPageAllocator();
    }
    else
    {
        pageAllocator = threadData->GetPageAllocator();
    }

    CodeGenWorkItem *const codeGenWork = static_cast<CodeGenWorkItem *>(job);

    switch (codeGenWork->Type())
    {
    case JsLoopBodyWorkItemType:
    {
        JsLoopBodyCodeGen* loopBodyCodeGenWorkItem = (JsLoopBodyCodeGen*)codeGenWork;
        Js::FunctionBody* fn = loopBodyCodeGenWorkItem->GetFunctionBody();

        if (fn->GetNativeEntryPointUsed() && fn->GetCanReleaseLoopHeaders()
#ifdef ASMJS_PLAT
            && (!fn->GetIsAsmJsFunction() || !(loopBodyCodeGenWorkItem->loopHeader->GetCurrentEntryPointInfo()->GetIsTJMode()))
#endif
        )
        {
            loopBodyCodeGenWorkItem->loopHeader->ResetInterpreterCount();
            return false;
        }
        // Unless we're in a ForceNative configuration, ignore this workitem if it exceeds JIT limits
        if (fn->ForceJITLoopBody() || !WorkItemExceedsJITLimits(codeGenWork))
        {
            CodeGen(pageAllocator, codeGenWork, foreground);
            return true;
        }
        Js::EntryPointInfo * entryPoint = loopBodyCodeGenWorkItem->GetEntryPoint();
        entryPoint->SetJITCapReached();
        return false;
    }
    case JsFunctionType:
    {
        // Unless we're in a ForceNative configuration, ignore this workitem if it exceeds JIT limits
        if (IS_PREJIT_ON() || Js::Configuration::Global.flags.ForceNative || !WorkItemExceedsJITLimits(codeGenWork))
        {
            CodeGen(pageAllocator, codeGenWork, foreground);
            return true;
        }
#if ENABLE_DEBUG_CONFIG_OPTIONS
        job->failureReason = Job::FailureReason::ExceedJITLimit;
#endif
        return false;
    }

    default:
        Assume(UNREACHED);
    }
#if ENABLE_DEBUG_CONFIG_OPTIONS
    job->failureReason = Job::FailureReason::Unknown;
#endif
    return false;
}